

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O1

Vec_Ptr_t * collectCSSignalsWithDSC(Abc_Ntk_t *pNtk,Aig_Man_t *pAig)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  void *local_40;
  
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 8;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(0x40);
  pVVar4->pArray = ppvVar5;
  if (pAig->nTruePos < 1) {
    local_40 = (void *)0x0;
  }
  else {
    lVar7 = 0;
    local_40 = (void *)0x0;
    do {
      if ((pAig->vCos->nSize <= lVar7) || (pNtk->vPos->nSize <= lVar7)) {
LAB_005b1e68:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = pAig->vCos->pArray[lVar7];
      pcVar6 = Abc_ObjName((Abc_Obj_t *)pNtk->vPos->pArray[lVar7]);
      pcVar6 = strstr(pcVar6,"csLiveConst_");
      if (pcVar6 == (char *)0x0) {
        if (pNtk->vPos->nSize <= lVar7) goto LAB_005b1e68;
        pcVar6 = Abc_ObjName((Abc_Obj_t *)pNtk->vPos->pArray[lVar7]);
        pcVar6 = strstr(pcVar6,"csLiveTarget_");
        if (pcVar6 != (char *)0x0) {
          local_40 = *(void **)((long)pvVar3 + 8);
        }
      }
      else {
        pvVar3 = *(void **)((long)pvVar3 + 8);
        uVar1 = pVVar4->nSize;
        uVar2 = pVVar4->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
            }
            iVar8 = 0x10;
          }
          else {
            iVar8 = uVar2 * 2;
            if (iVar8 <= (int)uVar2) goto LAB_005b1d92;
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
            }
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = iVar8;
        }
LAB_005b1d92:
        pVVar4->nSize = uVar1 + 1;
        pVVar4->pArray[(int)uVar1] = pvVar3;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pAig->nTruePos);
  }
  if (local_40 == (void *)0x0) {
    __assert_fail("pConsequent",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                  ,0xfa,"Vec_Ptr_t *collectCSSignalsWithDSC(Abc_Ntk_t *, Aig_Man_t *)");
  }
  uVar1 = pVVar4->nSize;
  uVar2 = pVVar4->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
      }
      iVar8 = 0x10;
    }
    else {
      iVar8 = uVar2 * 2;
      if (iVar8 <= (int)uVar2) goto LAB_005b1e3d;
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
      }
    }
    pVVar4->pArray = ppvVar5;
    pVVar4->nCap = iVar8;
  }
LAB_005b1e3d:
  pVVar4->nSize = uVar1 + 1;
  pVVar4->pArray[(int)uVar1] = local_40;
  return pVVar4;
}

Assistant:

Vec_Ptr_t *collectCSSignalsWithDSC( Abc_Ntk_t *pNtk, Aig_Man_t *pAig )
{
	int i;
	Aig_Obj_t *pObj, *pConsequent = NULL;
	Vec_Ptr_t *vNodeArray;

	vNodeArray = Vec_PtrAlloc(1);

	Saig_ManForEachPo( pAig, pObj, i )
	{
		if( strstr( Abc_ObjName(Abc_NtkPo( pNtk, i )), "csLiveConst_" ) != NULL )
			Vec_PtrPush( vNodeArray, Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObj), Aig_ObjFaninC0(pObj)) );	
		else if( strstr( Abc_ObjName(Abc_NtkPo( pNtk, i )), "csLiveTarget_" ) != NULL )
			pConsequent = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObj), Aig_ObjFaninC0(pObj));
	}
	assert( pConsequent );
	Vec_PtrPush( vNodeArray, pConsequent );	
	return vNodeArray;
}